

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O0

void __thiscall
nanoflann::
KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
::buildIndex(KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
             *this)

{
  size_t sVar1;
  NodePtr pNVar2;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
  *this_local;
  
  sVar1 = anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor::kdtree_get_point_count
                    (this->dataset);
  (this->
  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
  ).m_size = sVar1;
  (this->
  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
  ).m_size_at_index_build =
       (this->
       super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
       ).m_size;
  init_vind(this);
  KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
  ::freeIndex(&this->
               super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
              ,this);
  (this->
  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
  ).m_size_at_index_build =
       (this->
       super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
       ).m_size;
  if ((this->
      super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
      ).m_size != 0) {
    computeBoundingBox(this,&(this->
                             super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                             ).root_bbox);
    pNVar2 = KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
             ::divideTree(&this->
                           super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                          ,this,0,(this->
                                  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                                  ).m_size,
                          &(this->
                           super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                           ).root_bbox);
    (this->
    super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
    ).root_node = pNVar2;
  }
  return;
}

Assistant:

void buildIndex() {
    BaseClassRef::m_size = dataset.kdtree_get_point_count();
    BaseClassRef::m_size_at_index_build = BaseClassRef::m_size;
    init_vind();
    this->freeIndex(*this);
    BaseClassRef::m_size_at_index_build = BaseClassRef::m_size;
    if (BaseClassRef::m_size == 0)
      return;
    computeBoundingBox(BaseClassRef::root_bbox);
    BaseClassRef::root_node =
        this->divideTree(*this, 0, BaseClassRef::m_size,
                         BaseClassRef::root_bbox); // construct the tree
  }